

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int CVodeSetEpsProj(void *cvode_mem,sunrealtype eps)

{
  double in_XMM0_Qa;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvAccessProjMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,(CVodeProjMem *)0x122e9a);
  if (local_4 == 0) {
    if (0.0 < in_XMM0_Qa) {
      *(double *)(in_stack_ffffffffffffffd0 + 0x30) = in_XMM0_Qa;
    }
    else {
      *(undefined1 **)(in_stack_ffffffffffffffd0 + 0x30) = &DAT_3fb999999999999a;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetEpsProj(void* cvode_mem, sunrealtype eps)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set the projection tolerance */
  if (eps <= ZERO)
  {
    /* Restore default */
    proj_mem->eps_proj = PROJ_EPS;
  }
  else
  {
    /* Update projection tolerance */
    proj_mem->eps_proj = eps;
  }

  return (CV_SUCCESS);
}